

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,StringPiece s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  
  lVar4 = s.length_;
  uVar1 = this->length_;
  uVar3 = 0xffffffffffffffff;
  if (lVar4 <= (long)uVar1) {
    if (lVar4 == 0) {
      uVar3 = pos;
      if (uVar1 < pos) {
        uVar3 = uVar1;
      }
    }
    else {
      if (uVar1 - lVar4 < pos) {
        pos = uVar1 - lVar4;
      }
      pcVar5 = this->ptr_ + lVar4 + pos;
      pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (this->ptr_,pcVar5,s.ptr_,s.ptr_ + lVar4);
      uVar3 = 0xffffffffffffffff;
      if (pcVar2 != pcVar5) {
        uVar3 = (long)pcVar2 - (long)this->ptr_;
      }
    }
  }
  return uVar3;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(StringPiece s, size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_t ulen = length_;
  if (s.length_ == 0) return std::min(ulen, pos);

  const char* last = ptr_ + std::min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}